

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O2

void __thiscall Tree::quickSort(Tree *this,int L,int R)

{
  short sVar1;
  Node **ppNVar2;
  Node *pNVar3;
  long lVar4;
  int R_00;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  Node *temp;
  long lVar9;
  int iVar10;
  
  do {
    sVar1 = (this->m_queueIndexArray[(L + R) / 2]->field_1).data.year;
    R_00 = R;
    iVar5 = L;
    while (iVar5 <= R_00) {
      ppNVar2 = this->m_queueIndexArray;
      lVar6 = (long)iVar5 + -1;
      do {
        iVar7 = iVar5;
        pNVar3 = ppNVar2[lVar6 + 1];
        lVar6 = lVar6 + 1;
        iVar8 = iVar7 + 1;
        iVar5 = iVar8;
      } while ((pNVar3->field_1).data.year < sVar1);
      lVar9 = (long)R_00 + 1;
      do {
        iVar5 = R_00;
        lVar4 = lVar9 + -1;
        lVar9 = lVar9 + -1;
        iVar10 = iVar5 + -1;
        R_00 = iVar10;
      } while (sVar1 < (ppNVar2[lVar4]->field_1).data.year);
      R_00 = iVar5;
      iVar5 = iVar7;
      if (lVar6 <= lVar9) {
        ppNVar2[lVar6] = ppNVar2[lVar4];
        ppNVar2[lVar9] = pNVar3;
        R_00 = iVar10;
        iVar5 = iVar8;
      }
    }
    if (L < R_00) {
      quickSort(this,L,R_00);
    }
    L = iVar5;
  } while (iVar5 < R);
  return;
}

Assistant:

void quickSort(int L, int R) {
        int i = L;
        int j = R;
        Node temp = *m_queueIndexArray[(i + j) / 2];
        while (i <= j) {
            while ((*m_queueIndexArray[i]).data.year < temp.data.year) {
                i++;
            }
            while ((*m_queueIndexArray[j]).data.year > temp.data.year) {
                j--;
            }
            if (i <= j) {
                swapNodes(&m_queueIndexArray[i], &m_queueIndexArray[j]);
                i++;
                j--;
            }
        }
        if (L < j) {
            quickSort(L, j);
        }
        if (i < R) {
            quickSort(i, R);
        }
    }